

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestSchema::buildSchema(TestSchema *this)

{
  bool bVar1;
  Schema *in_RDI;
  Exception *e_1;
  FixedSchema fixed;
  RecordSchema nestedRecord;
  UnionSchema onion;
  Exception *e;
  bool caught;
  EnumSchema myenum;
  string s;
  ArraySchema array;
  MapSchema map;
  IntSchema intSchema;
  RecordSchema record;
  basic_cstring<const_char> *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffff948;
  LongSchema *in_stack_fffffffffffff950;
  allocator<char> *in_stack_fffffffffffff970;
  const_string *in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_string *in_stack_fffffffffffff988;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff990;
  unit_test_log_t *this_01;
  allocator<char> local_5c1;
  Schema local_5c0 [63];
  allocator<char> local_581;
  Schema local_580 [39];
  undefined1 local_559 [17];
  undefined1 local_548 [56];
  basic_cstring<const_char> local_510 [3];
  undefined1 local_4d9 [40];
  undefined1 local_4b1 [40];
  undefined8 local_489;
  FixedSchema local_468 [55];
  allocator<char> local_431;
  Schema local_430 [39];
  allocator<char> local_409;
  Schema local_408 [63];
  allocator<char> local_3c9;
  Schema local_3c8 [39];
  allocator<char> local_3a1;
  string local_3a0 [32];
  RecordSchema local_380 [31];
  allocator<char> local_361;
  Schema local_360 [80];
  UnionSchema local_310 [31];
  allocator<char> local_2f1;
  Schema local_2f0 [39];
  undefined1 local_2c9 [17];
  undefined1 local_2b8 [56];
  basic_cstring<const_char> local_280;
  allocator<char> local_261;
  string local_260 [38];
  undefined1 local_23a;
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  EnumSchema local_178 [31];
  allocator<char> local_159;
  Schema local_158 [32];
  Schema local_138 [24];
  ArraySchema local_120 [31];
  allocator<char> local_101;
  Schema local_100 [32];
  Schema local_e0 [24];
  MapSchema local_c8 [79];
  allocator<char> local_79;
  Schema local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  RecordSchema local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::RecordSchema(local_20,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::LongSchema::LongSchema(in_stack_fffffffffffff950);
  avro::RecordSchema::addField((string *)local_20,local_78);
  avro::LongSchema::~LongSchema((LongSchema *)0x298901);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  avro::IntSchema::IntSchema((IntSchema *)in_stack_fffffffffffff950);
  avro::IntSchema::IntSchema((IntSchema *)in_stack_fffffffffffff950);
  avro::MapSchema::MapSchema(local_c8,local_e0);
  avro::IntSchema::~IntSchema((IntSchema *)0x29895d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::allocator<char>::~allocator(&local_101);
  avro::DoubleSchema::DoubleSchema((DoubleSchema *)in_stack_fffffffffffff950);
  avro::ArraySchema::ArraySchema(local_120,local_138);
  avro::DoubleSchema::~DoubleSchema((DoubleSchema *)0x2989fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::allocator<char>::~allocator(&local_159);
  avro::RecordSchema::addField((string *)local_20,local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::EnumSchema(local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::addSymbol((string *)local_178);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::addSymbol((string *)local_178);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::addSymbol((string *)local_178);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::addSymbol((string *)local_178);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  local_23a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::EnumSchema::addSymbol((string *)local_178);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,(size_t)in_stack_fffffffffffff980
               ,in_stack_fffffffffffff978);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2c9 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_2c9[0] = 1;
    in_stack_fffffffffffff948 = "true";
    in_stack_fffffffffffff940 = (basic_cstring<const_char> *)local_2c9;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2b8,local_2c9 + 1,0x62,1,2,&local_23a,"caught");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2991e9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  avro::UnionSchema::UnionSchema(local_310);
  avro::NullSchema::NullSchema((NullSchema *)in_stack_fffffffffffff950);
  avro::UnionSchema::addType((Schema *)local_310);
  avro::NullSchema::~NullSchema((NullSchema *)0x2992a4);
  avro::UnionSchema::addType((Schema *)local_310);
  avro::FloatSchema::FloatSchema((FloatSchema *)in_stack_fffffffffffff950);
  avro::UnionSchema::addType((Schema *)local_310);
  avro::FloatSchema::~FloatSchema((FloatSchema *)0x2992ee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,local_360);
  std::__cxx11::string::~string((string *)local_360);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::RecordSchema(local_380,local_3a0);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::FloatSchema::FloatSchema((FloatSchema *)in_stack_fffffffffffff950);
  avro::RecordSchema::addField((string *)local_380,local_3c8);
  avro::FloatSchema::~FloatSchema((FloatSchema *)0x299420);
  std::__cxx11::string::~string((string *)local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,local_408);
  std::__cxx11::string::~string((string *)local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::BoolSchema::BoolSchema((BoolSchema *)in_stack_fffffffffffff950);
  avro::RecordSchema::addField((string *)local_20,local_430);
  avro::BoolSchema::~BoolSchema((BoolSchema *)0x299508);
  std::__cxx11::string::~string((string *)local_430);
  std::allocator<char>::~allocator(&local_431);
  this_01 = (unit_test_log_t *)&local_489;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::FixedSchema::FixedSchema(local_468,0x10,(string *)((long)&local_489 + 1));
  std::__cxx11::string::~string((string *)((long)&local_489 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  file = (const_string *)local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,(Schema *)(local_4b1 + 1));
  std::__cxx11::string::~string((string *)(local_4b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b1);
  local_23a = 0;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::LongSchema::LongSchema(in_stack_fffffffffffff950);
  avro::RecordSchema::addField((string *)local_20,(Schema *)(local_4d9 + 1));
  avro::LongSchema::~LongSchema((LongSchema *)0x29965b);
  std::__cxx11::string::~string((string *)(local_4d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4d9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_510,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)this_00,in_stack_fffffffffffff978);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_559 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_559[0] = 1;
    in_stack_fffffffffffff948 = "true";
    in_stack_fffffffffffff940 = (basic_cstring<const_char> *)local_559;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_548,local_559 + 1,0x7e,1,2,&local_23a,"caught");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x299bc5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::LongSchema::LongSchema(in_stack_fffffffffffff950);
  avro::RecordSchema::addField((string *)local_20,local_580);
  avro::LongSchema::~LongSchema((LongSchema *)0x299c3a);
  std::__cxx11::string::~string((string *)local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  avro::RecordSchema::addField((string *)local_20,local_5c0);
  std::__cxx11::string::~string((string *)local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  avro::ValidSchema::setSchema(in_RDI);
  avro::FixedSchema::~FixedSchema((FixedSchema *)0x299cde);
  avro::RecordSchema::~RecordSchema((RecordSchema *)0x299ceb);
  avro::UnionSchema::~UnionSchema((UnionSchema *)0x299cf8);
  avro::EnumSchema::~EnumSchema((EnumSchema *)0x299d05);
  std::__cxx11::string::~string((string *)local_158);
  avro::ArraySchema::~ArraySchema((ArraySchema *)0x299d1f);
  avro::MapSchema::~MapSchema((MapSchema *)0x299d2c);
  avro::IntSchema::~IntSchema((IntSchema *)0x299d39);
  avro::RecordSchema::~RecordSchema((RecordSchema *)0x299d46);
  return;
}

Assistant:

void buildSchema()
    {
        RecordSchema record("RootRecord");

        record.addField("mylong", LongSchema());

        IntSchema intSchema;
        avro::MapSchema map = MapSchema(IntSchema());

        record.addField("mymap", map);

        ArraySchema array = ArraySchema(DoubleSchema());

        const std::string s("myarray");
        record.addField(s, array);

        EnumSchema myenum("ExampleEnum");
        myenum.addSymbol("zero");
        myenum.addSymbol("one");
        myenum.addSymbol("two");
        myenum.addSymbol("three");

        bool caught = false;
        try {
            myenum.addSymbol("three");
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("myenum", myenum); 

        UnionSchema onion;
        onion.addType(NullSchema());
        onion.addType(map);
        onion.addType(FloatSchema());
       
        record.addField("myunion", onion); 

        RecordSchema nestedRecord("NestedRecord");
        nestedRecord.addField("floatInNested", FloatSchema());

        record.addField("nested", nestedRecord);

        record.addField("mybool", BoolSchema());
        FixedSchema fixed(16, "fixed16");
        record.addField("myfixed", fixed);

        caught = false;
        try {
            record.addField("mylong", LongSchema());
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("mylong2", LongSchema());

        record.addField("anotherint", intSchema);

        schema_.setSchema(record);
    }